

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O1

DdNode * cuddUniqueInter(DdManager *unique,int index,DdNode *T,DdNode *E)

{
  void *pvVar1;
  DdSubtable *pDVar2;
  int iVar3;
  DdNode **ppDVar4;
  DdNode *pDVar5;
  DdSubtable *pDVar6;
  DdSubtable *pDVar7;
  DdSubtable *__ptr;
  DdSubtable *__ptr_00;
  DdNode *pDVar8;
  DdNode *pDVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  int *piVar14;
  uint uVar15;
  int iVar16;
  int index_00;
  size_t __size;
  uint uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  DdNode **ppDVar21;
  int iVar22;
  long lVar23;
  bool bVar24;
  DdSubtable *local_48;
  
  uVar17 = unique->size;
  uVar20 = (ulong)uVar17;
  if ((int)uVar17 <= index) {
    lVar10 = (long)(int)uVar17;
    iVar3 = unique->maxSize;
    uVar18 = unique->initSlots;
    lVar11 = (long)(int)uVar18;
    if (iVar3 <= index) {
      iVar22 = index + 10;
      lVar23 = (long)iVar22;
      pDVar6 = (DdSubtable *)malloc(lVar23 * 0x38);
      if (pDVar6 == (DdSubtable *)0x0) goto LAB_007f4f8a;
      pDVar7 = (DdSubtable *)malloc(lVar23 * 8);
      if (pDVar7 != (DdSubtable *)0x0) {
        __size = lVar23 << 2;
        __ptr = (DdSubtable *)malloc(__size);
        if (__ptr == (DdSubtable *)0x0) {
          free(pDVar6);
          pDVar6 = pDVar7;
        }
        else {
          __ptr_00 = (DdSubtable *)malloc(__size);
          if (__ptr_00 != (DdSubtable *)0x0) {
            if (unique->map == (int *)0x0) {
              local_48 = (DdSubtable *)0x0;
            }
            else {
              local_48 = (DdSubtable *)malloc(__size);
              if (local_48 == (DdSubtable *)0x0) {
                free(pDVar6);
                free(pDVar7);
                free(__ptr);
                pDVar6 = __ptr_00;
                goto LAB_007f4f85;
              }
              unique->memused = unique->memused + (long)(iVar22 - iVar3) * 4;
            }
            unique->memused = unique->memused + (lVar11 * 8 + 0x48) * (long)(iVar22 - iVar3);
            if (unique->maxSizeZ < iVar22) {
              if (unique->stack != (DdNode **)0x0) {
                free(unique->stack);
                unique->stack = (DdNode **)0x0;
              }
              ppDVar4 = (DdNode **)malloc((long)index * 8 + 0x58);
              unique->stack = ppDVar4;
              if (ppDVar4 == (DdNode **)0x0) {
                free(pDVar6);
                free(pDVar7);
                free(__ptr);
                free(__ptr_00);
                if ((local_48 == (DdSubtable *)0x0) ||
                   (pDVar6 = local_48, unique->map == (int *)0x0)) goto LAB_007f4f8a;
                goto LAB_007f4f85;
              }
              *ppDVar4 = (DdNode *)0x0;
              iVar3 = unique->maxSize;
              if (unique->maxSize < unique->maxSizeZ) {
                iVar3 = unique->maxSizeZ;
              }
              unique->memused = unique->memused + (long)(iVar22 - iVar3) * 8;
            }
            if (0 < (int)uVar17) {
              pDVar2 = unique->subtables;
              piVar13 = unique->perm;
              ppDVar4 = unique->vars;
              piVar14 = unique->invperm;
              lVar23 = 0xc;
              lVar19 = 0;
              do {
                *(undefined4 *)((long)pDVar6 + lVar23 * 4 + -0x24) =
                     *(undefined4 *)((long)pDVar2 + lVar23 * 4 + -0x24);
                *(undefined4 *)((long)pDVar6 + lVar23 * 4 + -0x28) =
                     *(undefined4 *)((long)pDVar2 + lVar23 * 4 + -0x28);
                *(undefined4 *)((long)pDVar6 + lVar23 * 4 + -0x20) =
                     *(undefined4 *)((long)pDVar2 + lVar23 * 4 + -0x20);
                *(undefined4 *)((long)pDVar6 + lVar23 * 4 + -0x1c) =
                     *(undefined4 *)((long)pDVar2 + lVar23 * 4 + -0x1c);
                *(undefined4 *)((long)pDVar6 + lVar23 * 4 + -0x18) =
                     *(undefined4 *)((long)pDVar2 + lVar23 * 4 + -0x18);
                *(undefined8 *)((long)pDVar6 + lVar23 * 4 + -0x30) =
                     *(undefined8 *)((long)pDVar2 + lVar23 * 4 + -0x30);
                *(undefined4 *)((long)pDVar6 + lVar23 * 4 + -0x10) =
                     *(undefined4 *)((long)pDVar2 + lVar23 * 4 + -0x10);
                *(undefined4 *)((long)pDVar6 + lVar23 * 4 + -0xc) =
                     *(undefined4 *)((long)pDVar2 + lVar23 * 4 + -0xc);
                *(undefined4 *)((long)pDVar6 + lVar23 * 4 + -8) =
                     *(undefined4 *)((long)pDVar2 + lVar23 * 4 + -8);
                *(undefined4 *)((long)pDVar6 + lVar23 * 4 + -4) =
                     *(undefined4 *)((long)pDVar2 + lVar23 * 4 + -4);
                *(int *)((long)&pDVar6->nodelist + lVar23 * 4) =
                     *(int *)((long)&pDVar2->nodelist + lVar23 * 4);
                *(undefined8 *)((long)&pDVar7->nodelist + lVar19 * 2) =
                     *(undefined8 *)((long)ppDVar4 + lVar19 * 2);
                *(undefined4 *)((long)&__ptr->nodelist + lVar19) =
                     *(undefined4 *)((long)piVar13 + lVar19);
                *(undefined4 *)((long)&__ptr_00->nodelist + lVar19) =
                     *(undefined4 *)((long)piVar14 + lVar19);
                lVar23 = lVar23 + 0xe;
                lVar19 = lVar19 + 4;
              } while (uVar20 * 4 - lVar19 != 0);
            }
            if ((int)uVar17 <= index) {
              lVar23 = lVar10;
              do {
                pDVar6[lVar23].slots = uVar18;
                iVar3 = cuddComputeFloorLog2(uVar18);
                pDVar6[lVar23].shift = 0x20 - iVar3;
                pDVar6[lVar23].keys = 0;
                pDVar6[lVar23].maxKeys = uVar18 * 4;
                pDVar6[lVar23].dead = 0;
                pDVar2 = pDVar6 + lVar23;
                pDVar2->bindVar = 0;
                pDVar2->varType = CUDD_VAR_PRIMARY_INPUT;
                *(undefined8 *)(&pDVar2->bindVar + 2) = 0;
                pDVar6[lVar23].varToBeGrouped = CUDD_LAZY_NONE;
                *(int *)((long)&__ptr->nodelist + lVar23 * 4) = (int)lVar23;
                *(int *)((long)&__ptr_00->nodelist + lVar23 * 4) = (int)lVar23;
                ppDVar4 = (DdNode **)malloc(lVar11 << 3);
                pDVar6[lVar23].nodelist = ppDVar4;
                if (ppDVar4 == (DdNode **)0x0) goto LAB_007f4f8a;
                if (0 < (int)uVar18) {
                  uVar12 = 0;
                  do {
                    ppDVar4[uVar12] = &unique->sentinel;
                    uVar12 = uVar12 + 1;
                  } while (uVar18 != uVar12);
                }
                lVar23 = lVar23 + 1;
              } while (index + 1 != (int)lVar23);
            }
            piVar13 = unique->map;
            if (piVar13 != (int *)0x0) {
              if (0 < (int)uVar17) {
                uVar12 = 0;
                do {
                  *(int *)((long)&local_48->nodelist + uVar12 * 4) = piVar13[uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar20 != uVar12);
              }
              if ((int)uVar17 <= index) {
                piVar14 = (int *)((long)&local_48->nodelist + lVar10 * 4);
                do {
                  *piVar14 = (int)uVar20;
                  piVar14 = piVar14 + 1;
                  uVar15 = (int)uVar20 + 1;
                  uVar20 = (ulong)uVar15;
                } while (index + 1U != uVar15);
              }
              free(piVar13);
              unique->map = (int *)local_48;
            }
            if (unique->subtables != (DdSubtable *)0x0) {
              free(unique->subtables);
              unique->subtables = (DdSubtable *)0x0;
            }
            unique->subtables = pDVar6;
            unique->maxSize = iVar22;
            if (unique->vars != (DdNode **)0x0) {
              free(unique->vars);
              unique->vars = (DdNode **)0x0;
            }
            unique->vars = (DdNode **)pDVar7;
            if (unique->perm != (int *)0x0) {
              free(unique->perm);
              unique->perm = (int *)0x0;
            }
            unique->perm = (int *)__ptr;
            if (unique->invperm != (int *)0x0) {
              free(unique->invperm);
              unique->invperm = (int *)0x0;
            }
            unique->invperm = (int *)__ptr_00;
            goto LAB_007f4596;
          }
          free(pDVar6);
          free(pDVar7);
          pDVar6 = __ptr;
        }
      }
LAB_007f4f85:
      free(pDVar6);
LAB_007f4f8a:
      unique->errorCode = CUDD_MEMORY_OUT;
      return (DdNode *)0x0;
    }
    if ((int)uVar17 <= index) {
      lVar23 = lVar10;
      do {
        unique->subtables[lVar23].slots = uVar18;
        iVar3 = cuddComputeFloorLog2(uVar18);
        pDVar6 = unique->subtables;
        pDVar6[lVar23].shift = 0x20 - iVar3;
        pDVar6[lVar23].keys = 0;
        pDVar6[lVar23].maxKeys = uVar18 * 4;
        pDVar6[lVar23].dead = 0;
        pDVar6[lVar23].varToBeGrouped = CUDD_LAZY_NONE;
        pDVar7 = pDVar6 + lVar23;
        pDVar7->bindVar = 0;
        pDVar7->varType = CUDD_VAR_PRIMARY_INPUT;
        *(undefined8 *)(&pDVar7->bindVar + 2) = 0;
        iVar3 = (int)lVar23;
        unique->perm[lVar23] = iVar3;
        unique->invperm[lVar23] = iVar3;
        ppDVar4 = (DdNode **)malloc(lVar11 << 3);
        pDVar6[lVar23].nodelist = ppDVar4;
        if (ppDVar4 == (DdNode **)0x0) {
          if ((int)uVar17 < iVar3) {
            lVar11 = lVar10 * 0x38;
            lVar10 = iVar3 - lVar10;
            do {
              pvVar1 = *(void **)((long)&unique->subtables->nodelist + lVar11);
              if (pvVar1 != (void *)0x0) {
                free(pvVar1);
                *(undefined8 *)((long)&unique->subtables->nodelist + lVar11) = 0;
              }
              lVar11 = lVar11 + 0x38;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
          }
          goto LAB_007f4f8a;
        }
        if (0 < (int)uVar18) {
          uVar12 = 0;
          do {
            ppDVar4[uVar12] = &unique->sentinel;
            uVar12 = uVar12 + 1;
          } while (uVar18 != uVar12);
        }
        lVar23 = lVar23 + 1;
      } while (index + 1 != (int)lVar23);
    }
    if ((int)uVar17 <= index && unique->map != (int *)0x0) {
      piVar13 = unique->map + lVar10;
      do {
        *piVar13 = (int)uVar20;
        piVar13 = piVar13 + 1;
        uVar15 = (int)uVar20 + 1;
        uVar20 = (ulong)uVar15;
      } while (index + 1U != uVar15);
    }
LAB_007f4596:
    pDVar8 = unique->one;
    iVar22 = index + 1;
    unique->size = iVar22;
    iVar3 = uVar18 * (iVar22 - uVar17);
    uVar15 = unique->slots + iVar3;
    unique->slots = uVar15;
    unique->minDead = (uint)(long)((double)uVar15 * unique->gcFrac);
    uVar18 = unique->maxCacheHard;
    if (uVar15 * 4 < unique->maxCacheHard) {
      uVar18 = uVar15 * 4;
    }
    iVar16 = uVar18 + unique->cacheSlots * -2;
    unique->cacheSlack = iVar16;
    if (-1 < iVar16 && unique->cacheSlots < uVar15 >> 1) {
      cuddCacheResize(unique);
    }
    iVar16 = unique->autoDyn;
    unique->autoDyn = 0;
    if ((int)uVar17 <= index) {
      lVar11 = lVar10;
      do {
        index_00 = (int)lVar11;
        pDVar5 = cuddUniqueInter(unique,index_00,pDVar8,(DdNode *)((ulong)pDVar8 ^ 1));
        unique->vars[lVar11] = pDVar5;
        if (unique->vars[lVar11] == (DdNode *)0x0) {
          unique->autoDyn = iVar16;
          if ((int)uVar17 < index_00) {
            lVar11 = lVar10;
            do {
              Cudd_IterDerefBdd(unique,unique->vars[lVar11]);
              ppDVar4 = unique->vars;
              ppDVar4[lVar11]->next = unique->nextFree;
              unique->nextFree = ppDVar4[lVar11];
              ppDVar4[lVar11] = (DdNode *)0x0;
              lVar11 = lVar11 + 1;
            } while (index_00 != lVar11);
          }
          if ((int)uVar17 <= index) {
            lVar10 = lVar10 * 0x38;
            iVar22 = (index - uVar17) + 1;
            do {
              pvVar1 = *(void **)((long)&unique->subtables->nodelist + lVar10);
              if (pvVar1 != (void *)0x0) {
                free(pvVar1);
                *(undefined8 *)((long)&unique->subtables->nodelist + lVar10) = 0;
              }
              *(undefined8 *)((long)&unique->subtables->nodelist + lVar10) = 0;
              lVar10 = lVar10 + 0x38;
              iVar22 = iVar22 + -1;
            } while (iVar22 != 0);
          }
          unique->size = uVar17;
          uVar18 = unique->slots - iVar3;
          unique->slots = uVar18;
          unique->minDead = (uint)(long)((double)uVar18 * unique->gcFrac);
          uVar17 = unique->maxCacheHard;
          if (uVar18 * 4 < unique->maxCacheHard) {
            uVar17 = uVar18 * 4;
          }
          iVar3 = uVar17 + unique->cacheSlots * -2;
          unique->cacheSlack = iVar3;
          if (iVar3 < 0 || uVar18 >> 1 <= unique->cacheSlots) {
            return (DdNode *)0x0;
          }
          cuddCacheResize(unique);
          return (DdNode *)0x0;
        }
        piVar13 = (int *)(((ulong)unique->vars[lVar11] & 0xfffffffffffffffe) + 4);
        *piVar13 = *piVar13 + 1;
        lVar11 = lVar11 + 1;
      } while (iVar22 != (int)lVar11);
    }
    unique->autoDyn = iVar16;
  }
  pDVar7 = unique->subtables;
  uVar17 = unique->perm[index];
  pDVar6 = pDVar7 + uVar17;
  uVar12 = (ulong)T & 0xfffffffffffffffe;
  uVar18 = (uint)T & 1;
  uVar20 = (ulong)E & 0xfffffffffffffffe;
  uVar15 = (uint)E & 1;
  ppDVar4 = pDVar7[uVar17].nodelist +
            (int)((uVar15 + *(int *)(uVar20 + 0x20) * 2 +
                  (uVar18 + *(int *)(uVar12 + 0x20) * 2) * 0xc00005) * 0x40f1f9 >>
                 ((byte)pDVar7[uVar17].shift & 0x1f));
  do {
    ppDVar21 = ppDVar4;
    pDVar8 = *ppDVar21;
    ppDVar4 = &pDVar8->next;
  } while (T < (pDVar8->type).kids.T);
  bVar24 = (pDVar8->type).kids.T == T;
  if (bVar24) {
    if (E < (pDVar8->type).kids.E) {
      do {
        pDVar5 = pDVar8;
        pDVar8 = pDVar5->next;
        bVar24 = (pDVar8->type).kids.T == T;
        if (!bVar24) {
          ppDVar21 = &pDVar5->next;
          goto LAB_007f4717;
        }
      } while (E < (pDVar8->type).kids.E);
      ppDVar21 = &pDVar5->next;
    }
    if ((bVar24) && ((pDVar8->type).kids.E == E)) {
      if (pDVar8->ref == 0) {
        cuddReclaim(unique,pDVar8);
        return pDVar8;
      }
      return pDVar8;
    }
  }
LAB_007f4717:
  if ((unique->autoDyn != 0) &&
     (unique->nextDyn <= unique->keys - (unique->countDead & unique->dead))) {
    iVar3 = Cudd_ReduceHeap(unique,unique->autoMethod,10);
    if (iVar3 != 0) {
      return (DdNode *)0x0;
    }
    unique->reordered = 2;
    return (DdNode *)0x0;
  }
  if (pDVar6->keys <= pDVar6->maxKeys) goto LAB_007f495a;
  if (unique->gcEnabled == 0) {
LAB_007f48dc:
    cuddRehash(unique,uVar17);
  }
  else {
    if ((unique->dead <= unique->minDead) &&
       ((unique->dead <= unique->minDead >> 1 ||
        ((double)pDVar6->dead <= (double)pDVar6->keys * 0.95)))) goto LAB_007f48dc;
    cuddGarbageCollect(unique,1);
  }
  ppDVar4 = pDVar6->nodelist +
            (int)((uVar15 + *(int *)(uVar20 + 0x20) * 2 +
                  (uVar18 + *(int *)(uVar12 + 0x20) * 2) * 0xc00005) * 0x40f1f9 >>
                 ((byte)pDVar6->shift & 0x1f));
  do {
    ppDVar21 = ppDVar4;
    pDVar8 = *ppDVar21;
    ppDVar4 = &pDVar8->next;
  } while (T < (pDVar8->type).kids.T);
  if (((pDVar8->type).kids.T == T) && (E < (pDVar8->type).kids.E)) {
    do {
      pDVar5 = pDVar8;
      pDVar8 = pDVar5->next;
      if ((pDVar8->type).kids.T != T) break;
    } while (E < (pDVar8->type).kids.E);
    ppDVar21 = &pDVar5->next;
  }
LAB_007f495a:
  iVar3 = unique->garbageCollections;
  pDVar8 = cuddAllocNode(unique);
  if (pDVar8 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  unique->keys = unique->keys + 1;
  pDVar6->keys = pDVar6->keys + 1;
  if (iVar3 != unique->garbageCollections) {
    ppDVar4 = pDVar6->nodelist +
              (int)((uVar15 + *(int *)(uVar20 + 0x20) * 2 +
                    (uVar18 + *(int *)(uVar12 + 0x20) * 2) * 0xc00005) * 0x40f1f9 >>
                   ((byte)pDVar6->shift & 0x1f));
    do {
      ppDVar21 = ppDVar4;
      pDVar5 = *ppDVar21;
      ppDVar4 = &pDVar5->next;
    } while (T < (pDVar5->type).kids.T);
    if (((pDVar5->type).kids.T == T) && (E < (pDVar5->type).kids.E)) {
      do {
        pDVar9 = pDVar5;
        pDVar5 = pDVar9->next;
        if ((pDVar5->type).kids.T != T) break;
      } while (E < (pDVar5->type).kids.E);
      ppDVar21 = &pDVar9->next;
    }
  }
  pDVar8->index = index;
  (pDVar8->type).kids.T = T;
  (pDVar8->type).kids.E = E;
  pDVar8->next = *ppDVar21;
  *ppDVar21 = pDVar8;
  T->ref = T->ref + 1;
  *(int *)(uVar20 + 4) = *(int *)(uVar20 + 4) + 1;
  return pDVar8;
}

Assistant:

DdNode *
cuddUniqueInter(
  DdManager * unique,
  int  index,
  DdNode * T,
  DdNode * E)
{
    int pos;
    unsigned int level;
    int retval;
    DdNodePtr *nodelist;
    DdNode *looking;
    DdNodePtr *previousP;
    DdSubtable *subtable;
    int gcNumber;

#ifdef DD_UNIQUE_PROFILE
    unique->uniqueLookUps++;
#endif

    if (index >= unique->size) {
        if (!ddResizeTable(unique,index)) return(NULL);
    }

    level = unique->perm[index];
    subtable = &(unique->subtables[level]);

#ifdef DD_DEBUG
    assert(level < (unsigned) cuddI(unique,T->index));
    assert(level < (unsigned) cuddI(unique,Cudd_Regular(E)->index));
#endif

    pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
    nodelist = subtable->nodelist;
    previousP = &(nodelist[pos]);
    looking = *previousP;

    while (T < cuddT(looking)) {
        previousP = &(looking->next);
        looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
        unique->uniqueLinks++;
#endif
    }
    while (T == cuddT(looking) && E < cuddE(looking)) {
        previousP = &(looking->next);
        looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
        unique->uniqueLinks++;
#endif
    }
    if (T == cuddT(looking) && E == cuddE(looking)) {
        if (looking->ref == 0) {
            cuddReclaim(unique,looking);
        }
        return(looking);
    }

    /* countDead is 0 if deads should be counted and ~0 if they should not. */
    if (unique->autoDyn &&
    unique->keys - (unique->dead & unique->countDead) >= unique->nextDyn) {
#ifdef DD_DEBUG
        retval = Cudd_DebugCheck(unique);
        if (retval != 0) return(NULL);
        retval = Cudd_CheckKeys(unique);
        if (retval != 0) return(NULL);
#endif
        retval = Cudd_ReduceHeap(unique,unique->autoMethod,10); /* 10 = whatever */
        if (retval == 0) unique->reordered = 2;
#ifdef DD_DEBUG
        retval = Cudd_DebugCheck(unique);
        if (retval != 0) unique->reordered = 2;
        retval = Cudd_CheckKeys(unique);
        if (retval != 0) unique->reordered = 2;
#endif
        return(NULL);
    }

    if (subtable->keys > subtable->maxKeys) {
        if (unique->gcEnabled &&
            ((unique->dead > unique->minDead) ||
            ((unique->dead > unique->minDead / 2) &&
            (subtable->dead > subtable->keys * 0.95)))) { /* too many dead */
            (void) cuddGarbageCollect(unique,1);
        } else {
            cuddRehash(unique,(int)level);
        }
        /* Update pointer to insertion point. In the case of rehashing,
        ** the slot may have changed. In the case of garbage collection,
        ** the predecessor may have been dead. */
        pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
        nodelist = subtable->nodelist;
        previousP = &(nodelist[pos]);
        looking = *previousP;

        while (T < cuddT(looking)) {
            previousP = &(looking->next);
            looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
        while (T == cuddT(looking) && E < cuddE(looking)) {
            previousP = &(looking->next);
            looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
    }

    gcNumber = unique->garbageCollections;
    looking = cuddAllocNode(unique);
    if (looking == NULL) {
        return(NULL);
    }
    unique->keys++;
    subtable->keys++;

    if (gcNumber != unique->garbageCollections) {
        DdNode *looking2;
        pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
        nodelist = subtable->nodelist;
        previousP = &(nodelist[pos]);
        looking2 = *previousP;

        while (T < cuddT(looking2)) {
            previousP = &(looking2->next);
            looking2 = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
        while (T == cuddT(looking2) && E < cuddE(looking2)) {
            previousP = &(looking2->next);
            looking2 = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
    }
    looking->index = index;
    cuddT(looking) = T;
    cuddE(looking) = E;
    looking->next = *previousP;
    *previousP = looking;
    cuddSatInc(T->ref);         /* we know T is a regular pointer */
    cuddRef(E);

#ifdef DD_DEBUG
    cuddCheckCollisionOrdering(unique,level,pos);
#endif

//    assert( Cudd_Regular(T)->Id < 100000000 );
//    assert( Cudd_Regular(E)->Id < 100000000 );
    return(looking);

}